

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O2

void __thiscall KDReports::Test::testPageBreak(Test *this)

{
  char cVar1;
  int iVar2;
  Report report;
  TextElement local_50 [24];
  QArrayDataPointer<char16_t> local_38;
  undefined4 local_18;
  undefined2 local_14;
  undefined8 local_12;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  QString::QString((QString *)&local_38,"First page");
  KDReports::TextElement::TextElement(local_50,(QString *)&local_38);
  local_18 = 0;
  local_14 = 0xffff;
  local_12 = 0;
  KDReports::Report::addElement(&report,local_50,1);
  KDReports::TextElement::~TextElement(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  KDReports::Report::addPageBreak();
  QString::QString((QString *)&local_38,"Second page");
  KDReports::TextElement::TextElement(local_50,(QString *)&local_38);
  local_18 = 0;
  local_14 = 0xffff;
  local_12 = 0;
  KDReports::Report::addElement(&report,local_50,1);
  KDReports::TextElement::~TextElement(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  iVar2 = KDReports::Report::numberOfPages();
  cVar1 = QTest::qCompare(iVar2,2,"report.numberOfPages()","2",
                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                          ,0x2f);
  if (cVar1 != '\0') {
    KDReports::Report::addPageBreak();
    iVar2 = KDReports::Report::numberOfPages();
    cVar1 = QTest::qCompare(iVar2,3,"report.numberOfPages()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                            ,0x31);
    if (cVar1 != '\0') {
      KDReports::Report::addPageBreak();
      iVar2 = KDReports::Report::numberOfPages();
      cVar1 = QTest::qCompare(iVar2,3,"report.numberOfPages()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                              ,0x33);
      if (cVar1 != '\0') {
        local_38.d = (Data *)0x0;
        local_38.ptr = (char16_t *)0x0;
        local_38.size = 0;
        KDReports::TextElement::TextElement(local_50,(QString *)&local_38);
        local_18 = 0;
        local_14 = 0xffff;
        local_12 = 0;
        KDReports::Report::addElement(&report,local_50,1);
        KDReports::TextElement::~TextElement(local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
        KDReports::Report::addPageBreak();
        iVar2 = KDReports::Report::numberOfPages();
        QTest::qCompare(iVar2,4,"report.numberOfPages()","4",
                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                        ,0x36);
      }
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testPageBreak()
    {
        Report report;
        report.addElement(KDReports::TextElement("First page"));
        report.addPageBreak();
        report.addElement(KDReports::TextElement("Second page"));
        QCOMPARE(report.numberOfPages(), 2);
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 3);
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 3); // yep, it's a flag, can only be set once; documented.
        report.addElement(KDReports::TextElement(QString()));
        report.addPageBreak();
        QCOMPARE(report.numberOfPages(), 4);
    }